

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

int TIFFReadRGBAImageOriented
              (TIFF *tif,uint32_t rwidth,uint32_t rheight,uint32_t *raster,int orientation,int stop)

{
  int iVar1;
  char *module;
  TIFFRGBAImage img;
  char emsg [1024];
  TIFFRGBAImage local_4c8;
  char local_438 [1032];
  
  memset(local_438,0,0x400);
  iVar1 = TIFFRGBAImageOK(tif,local_438);
  if ((iVar1 != 0) && (iVar1 = TIFFRGBAImageBegin(&local_4c8,tif,stop,local_438), iVar1 != 0)) {
    local_4c8.req_orientation = (uint16_t)orientation;
    iVar1 = TIFFRGBAImageGet(&local_4c8,raster + (rheight - local_4c8.height) * rwidth,rwidth,
                             local_4c8.height);
    TIFFRGBAImageEnd(&local_4c8);
    return iVar1;
  }
  module = TIFFFileName(tif);
  TIFFErrorExtR(tif,module,"%s",local_438);
  return 0;
}

Assistant:

int TIFFReadRGBAImageOriented(TIFF *tif, uint32_t rwidth, uint32_t rheight,
                              uint32_t *raster, int orientation, int stop)
{
    char emsg[EMSG_BUF_SIZE] = "";
    TIFFRGBAImage img;
    int ok;

    if (TIFFRGBAImageOK(tif, emsg) && TIFFRGBAImageBegin(&img, tif, stop, emsg))
    {
        img.req_orientation = (uint16_t)orientation;
        /* XXX verify rwidth and rheight against width and height */
        ok = TIFFRGBAImageGet(&img, raster + (rheight - img.height) * rwidth,
                              rwidth, img.height);
        TIFFRGBAImageEnd(&img);
    }
    else
    {
        TIFFErrorExtR(tif, TIFFFileName(tif), "%s", emsg);
        ok = 0;
    }
    return (ok);
}